

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

void __thiscall
qclab::dense::SquareMatrix<double>::SquareMatrix
          (SquareMatrix<double> *this,SquareMatrix<double> *matrix)

{
  double dVar1;
  int64_t iVar2;
  double *pdVar3;
  type pdVar4;
  size_t local_38;
  int64_t i;
  double *data;
  SquareMatrix<double> *matrix_local;
  SquareMatrix<double> *this_local;
  
  iVar2 = size(matrix);
  this->size_ = iVar2;
  alloc_unique_array<double>((dense *)&this->data_,this->size_ * this->size_);
  pdVar3 = ptr(matrix);
  for (local_38 = 0; (long)local_38 < this->size_ * this->size_; local_38 = local_38 + 1) {
    dVar1 = pdVar3[local_38];
    pdVar4 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (&this->data_,local_38);
    *pdVar4 = dVar1;
  }
  return;
}

Assistant:

SquareMatrix( const SquareMatrix< T >& matrix )
        : size_( matrix.size() )
        , data_( alloc_unique_array< T >( size_ * size_ ) )
        {
          const T* data = matrix.ptr() ;
          #pragma omp parallel for
          for ( int64_t i = 0; i < size_*size_; i++ ) {
            data_[i] = data[i] ;
          }
        }